

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O2

void __thiscall ser::FieldsTable::TableFromJSON(FieldsTable *this,JSONNode *node)

{
  JSONNode **ppJVar1;
  JSONNode **ppJVar2;
  DataFieldInfo info;
  DataFieldInfo DStack_c8;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
           *)this);
  ppJVar1 = internalJSONNode::begin(node->internal);
  while( true ) {
    ppJVar2 = internalJSONNode::end(node->internal);
    if (ppJVar1 == ppJVar2) break;
    DataFieldInfo::DataFieldInfo(&DStack_c8);
    DataFieldInfo::FromJSON(&DStack_c8,*ppJVar1);
    RegisterField(this,&DStack_c8);
    DataFieldInfo::~DataFieldInfo(&DStack_c8);
    ppJVar1 = ppJVar1 + 1;
  }
  return;
}

Assistant:

void FieldsTable::TableFromJSON(const JSONNode& node)
{
    Cleanup();

    for (JSONNode::const_iterator iter = node.begin(); iter != node.end(); ++iter)
    {
        DataFieldInfo info;
        info.FromJSON(*iter);
        RegisterField(info);
    }
}